

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxRandom2::Emit(FxRandom2 *this,VMFunctionBuilder *build)

{
  _func_int **ptr;
  PClass *pPVar1;
  int iVar2;
  uint uVar3;
  PSymbol *pPVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  FName local_2c;
  
  local_2c.Index = 0x23f;
  pPVar4 = FindBuiltinFunction(&local_2c,BuiltinRandom);
  pPVar1 = PSymbolVMFunction::RegistrationInfo.MyClass;
  if ((pPVar4->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
    iVar2 = (**(pPVar4->super_PTypeBase).super_DObject._vptr_DObject)(pPVar4);
    (pPVar4->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
  }
  pPVar5 = (pPVar4->super_PTypeBase).super_DObject.Class;
  bVar9 = pPVar5 != (PClass *)0x0;
  if (pPVar5 != pPVar1 && bVar9) {
    do {
      pPVar5 = pPVar5->ParentClass;
      bVar9 = pPVar5 != (PClass *)0x0;
      if (pPVar5 == pPVar1) break;
    } while (pPVar5 != (PClass *)0x0);
  }
  if (!bVar9) {
    __assert_fail("sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x1572,"virtual ExpEmit FxRandom2::Emit(VMFunctionBuilder *)");
  }
  ptr = pPVar4[1].super_PTypeBase.super_DObject._vptr_DObject;
  if (ptr != (_func_int **)0x0) {
    bVar9 = this->EmitTail;
    uVar3 = VMFunctionBuilder::GetConstantAddress(build,this->rng,'\x02');
    uVar8 = 0;
    VMFunctionBuilder::Emit(build,0x46,0,7,uVar3);
    EmitParameter(build,this->mask,&(this->super_FxExpression).ScriptPosition);
    uVar3 = VMFunctionBuilder::GetConstantAddress(build,ptr,'\x01');
    VMFunctionBuilder::Emit(build,(uint)bVar9 + (uint)bVar9 * 2 + 0x49,uVar3,2,1);
    if (this->EmitTail == false) {
      uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
      uVar8 = (ulong)(uVar3 & 0xffff);
      uVar7 = 0;
      VMFunctionBuilder::Emit(build,0x4d,0,0,uVar3 & 0xffff);
      uVar6 = 0x1000000;
    }
    else {
      uVar7 = 0x800000;
      uVar6 = 0x1000001000000;
    }
    return (ExpEmit)(uVar6 | uVar7 | uVar8);
  }
  __assert_fail("((PSymbolVMFunction *)sym)->Function != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x1573,"virtual ExpEmit FxRandom2::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxRandom2::Emit(VMFunctionBuilder *build)
{
	// Call the BuiltinRandom function to generate the random number.
	VMFunction *callfunc;
	PSymbol *sym = FindBuiltinFunction(NAME_BuiltinRandom, BuiltinRandom);

	assert(sym->IsKindOf(RUNTIME_CLASS(PSymbolVMFunction)));
	assert(((PSymbolVMFunction *)sym)->Function != nullptr);
	callfunc = ((PSymbolVMFunction *)sym)->Function;

	int opcode = (EmitTail ? OP_TAIL_K : OP_CALL_K);

	build->Emit(OP_PARAM, 0, REGT_POINTER | REGT_KONST, build->GetConstantAddress(rng, ATAG_RNG));
	EmitParameter(build, mask, ScriptPosition);
	build->Emit(opcode, build->GetConstantAddress(callfunc, ATAG_OBJECT), 2, 1);

	if (EmitTail)
	{
		ExpEmit call;
		call.Final = true;
		return call;
	}

	ExpEmit out(build, REGT_INT);
	build->Emit(OP_RESULT, 0, REGT_INT, out.RegNum);
	return out;
}